

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void encode_cdef(AV1_COMMON *cm,aom_write_bit_buffer *wb)

{
  int data;
  aom_write_bit_buffer *in_RSI;
  AV1_COMMON *in_RDI;
  int i;
  int num_planes;
  int in_stack_ffffffffffffffe8;
  int bits;
  
  if ((in_RDI->seq_params->enable_cdef != '\0') && (((in_RDI->features).allow_intrabc & 1U) == 0)) {
    data = av1_num_planes(in_RDI);
    aom_wb_write_literal(in_RSI,data,in_stack_ffffffffffffffe8);
    aom_wb_write_literal(in_RSI,data,in_stack_ffffffffffffffe8);
    for (bits = 0; bits < (in_RDI->cdef_info).nb_cdef_strengths; bits = bits + 1) {
      aom_wb_write_literal(in_RSI,data,bits);
      if (1 < data) {
        aom_wb_write_literal(in_RSI,data,bits);
      }
    }
  }
  return;
}

Assistant:

static inline void encode_cdef(const AV1_COMMON *cm,
                               struct aom_write_bit_buffer *wb) {
  assert(!cm->features.coded_lossless);
  if (!cm->seq_params->enable_cdef) return;
  if (cm->features.allow_intrabc) return;
  const int num_planes = av1_num_planes(cm);
  int i;
  aom_wb_write_literal(wb, cm->cdef_info.cdef_damping - 3, 2);
  aom_wb_write_literal(wb, cm->cdef_info.cdef_bits, 2);
  for (i = 0; i < cm->cdef_info.nb_cdef_strengths; i++) {
    aom_wb_write_literal(wb, cm->cdef_info.cdef_strengths[i],
                         CDEF_STRENGTH_BITS);
    if (num_planes > 1)
      aom_wb_write_literal(wb, cm->cdef_info.cdef_uv_strengths[i],
                           CDEF_STRENGTH_BITS);
  }
}